

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O1

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint32_t *puVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  IROp1 IVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  SnapEntry SVar10;
  jit_State *J;
  SnapEntry *pSVar11;
  SnapEntry *pSVar12;
  bool bVar13;
  bool bVar14;
  TRef TVar15;
  undefined2 *puVar16;
  SnapShot *pSVar17;
  ulong uVar18;
  ushort uVar19;
  IRRef1 IVar20;
  ushort uVar21;
  SnapShot *pSVar22;
  SnapEntry *pSVar23;
  IRIns *pIVar24;
  IROpT IVar25;
  uint uVar26;
  uint uVar27;
  SnapShot *pSVar28;
  SnapShot *pSVar29;
  IRRef1 IVar30;
  uint uVar31;
  uint uVar32;
  SnapEntry *pSVar33;
  IRIns *pIVar34;
  uint32_t uVar35;
  ulong uVar36;
  IRRef ref;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  ulong uVar41;
  IRRef1 phi [64];
  uint local_f4;
  IRRef1 aIStack_b8 [68];
  
  J = *ud;
  uVar27 = (J->cur).nins;
  *(uint *)((long)ud + 0x10) = uVar27 - 0x8000;
  puVar16 = (undefined2 *)lj_mem_realloc(J->L,(void *)0x0,0,(ulong)(uVar27 - 0x8000) * 2);
  *(undefined2 **)((long)ud + 8) = puVar16;
  *puVar16 = 0x8000;
  (J->fold).ins.field_0.ot = 0x1180;
  (J->fold).ins.field_1.op12 = 0;
  lj_ir_emit(J);
  uVar7 = (J->cur).nsnap;
  uVar31 = (uint)uVar7 * 2 - 2;
  if (J->sizesnap < uVar31) {
    lj_snap_grow_buf_(J,uVar31);
  }
  uVar31 = uVar7 - 1;
  uVar32 = (uint)(J->cur).snap[uVar31].nent * (uVar7 - 2) + (J->cur).nsnapmap * 2;
  if (J->sizesnapmap < uVar32) {
    lj_snap_grow_map_(J,uVar32);
  }
  pSVar28 = (J->cur).snap;
  uVar32 = pSVar28[uVar31].mapofs;
  pSVar11 = (J->cur).snapmap;
  bVar3 = pSVar28[uVar31].nent;
  pSVar11[(ulong)uVar32 + (ulong)bVar3] = 0xff000000;
  local_f4 = 0;
  if (0x8001 < uVar27) {
    puVar1 = &(J->cur).nsnapmap;
    local_f4 = 0;
    uVar41 = 0x8001;
    pSVar28 = pSVar28 + 1;
    do {
      pSVar29 = pSVar28;
      if (pSVar28->ref <= uVar41) {
        pSVar29 = pSVar28 + 1;
        uVar31 = pSVar28->mapofs;
        uVar21 = (J->cur).nsnap;
        pSVar22 = (SnapShot *)((long)&((J->cur).snap)->mapofs + (ulong)((uint)uVar21 * 0xc));
        pSVar17 = pSVar29;
        if (pSVar29 == pSVar22) {
          pSVar17 = (SnapShot *)puVar1;
        }
        uVar40 = pSVar17->mapofs;
        bVar4 = pSVar28->nent;
        bVar5 = pSVar28->nslots;
        if ((char)(J->guardemit).irt < '\0') {
          uVar35 = (J->cur).nsnapmap;
          (J->cur).nsnap = uVar21 + 1;
        }
        else {
          uVar35 = pSVar22[-1].mapofs;
          pSVar22 = pSVar22 + -1;
        }
        pSVar12 = (J->cur).snapmap;
        uVar36 = 0;
        (J->guardemit).irt = '\0';
        pSVar22->mapofs = uVar35;
        pSVar22->ref = (IRRef1)(J->cur).nins;
        pSVar22->mcofs = 0;
        pSVar22->nslots = bVar5;
        pSVar22->topslot = pSVar28->topslot;
        pSVar22->count = '\0';
        uVar38 = 0;
        if (bVar4 != 0) {
          uVar38 = 0;
          uVar36 = 0;
          uVar18 = 0;
          do {
            uVar37 = pSVar12[uVar31 + uVar18];
            uVar39 = pSVar11[uVar32 + uVar36] >> 0x18;
            uVar26 = uVar37 >> 0x18;
            if (uVar39 < uVar26) {
              pSVar12[uVar35 + uVar38] = pSVar11[uVar32 + uVar36];
              uVar26 = (int)uVar36 + 1;
            }
            else {
              if (0x7fff < (uVar37 & 0xffff)) {
                uVar37 = (uint)(ushort)puVar16[(ulong)(uVar37 & 0xffff) - 0x8000] |
                         uVar37 & 0xfffb0000;
              }
              uVar26 = (int)uVar36 + (uint)(uVar39 == uVar26);
              pSVar12[uVar35 + uVar38] = uVar37;
              uVar18 = (ulong)((int)uVar18 + 1);
            }
            uVar36 = (ulong)uVar26;
            uVar38 = (ulong)((int)uVar38 + 1);
          } while ((uint)uVar18 < (uint)bVar4);
        }
        uVar26 = (uint)uVar38;
        uVar37 = (uint)uVar36;
        SVar10 = pSVar11[uVar32 + uVar36];
        while (SVar10 >> 0x18 < (uint)bVar5) {
          uVar37 = uVar37 + 1;
          uVar26 = (int)uVar38 + 1;
          pSVar12[uVar35 + uVar38] = SVar10;
          uVar38 = (ulong)uVar26;
          SVar10 = pSVar11[(ulong)uVar32 + (ulong)uVar37];
        }
        pSVar22->nent = (uint8_t)uVar26;
        pSVar23 = pSVar12 + (ulong)uVar35 + (ulong)uVar26;
        for (pSVar33 = pSVar12 + (ulong)uVar31 + (ulong)(uint)bVar4; pSVar33 < pSVar12 + uVar40;
            pSVar33 = pSVar33 + 1) {
          *pSVar23 = *pSVar33;
          pSVar23 = pSVar23 + 1;
        }
        *puVar1 = (uint32_t)((ulong)((long)pSVar23 - (long)pSVar12) >> 2);
      }
      pIVar34 = (J->cur).ir;
      uVar21 = pIVar34[uVar41].field_0.op1;
      uVar19 = uVar21;
      if ((short)uVar21 < 0) {
        uVar19 = puVar16[(ulong)uVar21 - 0x8000];
      }
      uVar8 = *(ushort *)((long)pIVar34 + uVar41 * 8 + 2);
      uVar9 = uVar8;
      if ((short)uVar8 < 0) {
        uVar9 = puVar16[(ulong)uVar8 - 0x8000];
      }
      if ((((lj_ir_mode[*(byte *)((long)pIVar34 + uVar41 * 8 + 5)] & 0x60) == 0) &&
          (uVar19 == uVar21)) && (uVar9 == uVar8)) {
        puVar16[uVar41 - 0x8000] = (short)uVar41;
      }
      else {
        bVar4 = *(byte *)((long)pIVar34 + uVar41 * 8 + 4);
        (J->fold).ins.field_0.ot = *(ushort *)((long)pIVar34 + uVar41 * 8 + 4) & 0xffbf;
        (J->fold).ins.field_0.op1 = uVar19;
        (J->fold).ins.field_0.op2 = uVar9;
        TVar15 = lj_opt_fold(J);
        uVar31 = TVar15 & 0xffff;
        uVar38 = (ulong)uVar31;
        IVar30 = (IRRef1)TVar15;
        puVar16[uVar41 - 0x8000] = IVar30;
        if (uVar41 != uVar38) {
          pIVar24 = (J->cur).ir;
          pIVar34 = pIVar24 + uVar38;
          if (uVar31 < uVar27) {
            if ((0x7fff < uVar31) &&
               (bVar5 = (byte)(pIVar34->field_0).ot,
               2 < (bVar5 & 0x1f) && (char)((bVar5 & 0x40) >> 6) == '\0')) {
              (pIVar34->field_1).t.irt = bVar5 | 0x40;
              if (0x3f < local_f4) {
LAB_0014d2ee:
                lj_trace_err(J,LJ_TRERR_PHIOV);
              }
              uVar38 = (ulong)local_f4;
              local_f4 = local_f4 + 1;
              aIStack_b8[uVar38] = IVar30;
            }
            bVar5 = (byte)(pIVar34->field_0).ot;
            if (((bVar5 ^ bVar4) & 0x1f) != 0) {
              uVar40 = bVar4 & 0x1f;
              uVar31 = uVar40 - 0x14;
              if ((uVar31 < 0xfffffffb) || (4 < (bVar5 & 0x1f) - 0xf)) {
                if ((uVar40 == 0xe) && ((bVar5 & 0x1f) - 0xf < 5)) {
                  IVar20 = 0x1d3;
                  IVar25 = 0x5b0e;
                }
                else {
                  if ((uVar31 < 0xfffffffb) || ((bVar5 & 0x1f) != 0xe)) {
                    lj_trace_err(J,LJ_TRERR_TYPEINS);
                  }
                  IVar20 = 0x326e;
                  IVar25 = 0x5b93;
                }
                (J->fold).ins.field_0.ot = IVar25;
                (J->fold).ins.field_0.op1 = IVar30;
                (J->fold).ins.field_0.op2 = IVar20;
                TVar15 = lj_opt_fold(J);
                uVar31 = TVar15 & 0xffff;
                puVar16[uVar41 - 0x8000] = (short)TVar15;
                pIVar24 = (IRIns *)((ulong)(uVar31 * 8) + (long)(J->cur).ir);
LAB_0014cf4c:
                if ((0x7fff < uVar31 && uVar31 < uVar27) &&
                   (bVar4 = (byte)(pIVar24->field_0).ot, (bVar4 & 0x40) == 0)) {
                  (pIVar24->field_1).t.irt = bVar4 | 0x40;
                  if (0x3f < local_f4) goto LAB_0014d2ee;
                  uVar38 = (ulong)local_f4;
                  local_f4 = local_f4 + 1;
                  aIStack_b8[uVar38] = (IRRef1)uVar31;
                }
              }
            }
          }
          else if (uVar27 < uVar31 && uVar38 != 0xffff) {
            IVar6 = (pIVar34->field_1).o;
            if ((IVar6 == '[') && ((pIVar34->field_0).op1 < uVar27)) {
LAB_0014cee4:
              uVar21 = *(ushort *)((long)pIVar34 + (ulong)(IVar6 != '[') * 2);
              uVar31 = (uint)uVar21;
              pIVar24 = pIVar24 + uVar21;
              goto LAB_0014cf4c;
            }
            if (IVar6 == 'I') {
              uVar21 = (pIVar34->field_0).op2;
              if ((uVar21 != 0x7fff) && (uVar21 <= uVar27 && uVar27 != uVar21)) goto LAB_0014cee4;
            }
          }
        }
      }
      uVar41 = uVar41 + 1;
      pSVar28 = pSVar29;
    } while (uVar41 != uVar27);
  }
  if (-1 < (char)(J->guardemit).irt) {
    uVar21 = (J->cur).nsnap - 1;
    (J->cur).nsnap = uVar21;
    (J->cur).nsnapmap = (J->cur).snap[uVar21].mapofs;
  }
  pSVar11[(ulong)uVar32 + (ulong)bVar3] = (J->cur).snapmap[((J->cur).snap)->nent];
  uVar21 = J->chain[0x11];
  if (local_f4 == 0) {
    bVar14 = true;
    uVar41 = 0;
  }
  else {
    uVar38 = 0;
    bVar14 = false;
    uVar41 = 0;
    do {
      uVar19 = aIStack_b8[uVar38];
      uVar36 = (ulong)uVar19;
      uVar8 = puVar16[uVar36 - 0x8000];
      if ((uVar19 == uVar8) || (uVar8 == 0xffff)) {
        pbVar2 = (byte *)((long)(J->cur).ir + uVar36 * 8 + 4);
        *pbVar2 = *pbVar2 & 0xbf;
      }
      else {
        uVar18 = (ulong)((int)uVar41 + 1);
        aIStack_b8[uVar41] = uVar19;
        pIVar34 = (J->cur).ir;
        uVar41 = uVar18;
        if ((pIVar34[uVar8].field_0.op1 != uVar19) &&
           (*(ushort *)((long)pIVar34 + (ulong)uVar8 * 8 + 2) != uVar19)) {
          pbVar2 = (byte *)((long)pIVar34 + uVar36 * 8 + 4);
          *pbVar2 = *pbVar2 | 0x20;
          bVar14 = true;
        }
      }
      uVar38 = uVar38 + 1;
    } while (local_f4 != uVar38);
    bVar14 = !bVar14;
  }
  if (!bVar14) {
    uVar27 = (J->cur).nins - 1;
    if (uVar21 < uVar27) {
      uVar38 = (ulong)uVar27;
      do {
        pIVar34 = (J->cur).ir;
        uVar19 = *(ushort *)((long)pIVar34 + uVar38 * 8 + 2);
        if ((short)uVar19 < 0) {
          pbVar2 = (byte *)((long)pIVar34 + (ulong)uVar19 * 8 + 4);
          *pbVar2 = *pbVar2 & 0xdf;
        }
        if ((short)pIVar34[uVar38].field_0.op1 < 0) {
          pbVar2 = (byte *)((long)(J->cur).ir + (ulong)pIVar34[uVar38].field_0.op1 * 8 + 4);
          *pbVar2 = *pbVar2 & 0xdf;
          uVar19 = pIVar34[uVar38].field_0.op1;
          if (((uVar19 < uVar21) && ((byte)(*(char *)((long)pIVar34 + uVar38 * 8 + 5) + 0xa1U) < 6))
             && (pIVar34 = (J->cur).ir, *(char *)((long)pIVar34 + (ulong)uVar19 * 8 + 5) == 'd')) {
            pIVar34 = pIVar34 + uVar19;
            do {
              if ((short)(pIVar34->field_0).op2 < 0) {
                pbVar2 = (byte *)((long)(J->cur).ir + (ulong)(pIVar34->field_0).op2 * 8 + 4);
                *pbVar2 = *pbVar2 & 0xdf;
              }
              if (-1 < (short)(pIVar34->field_0).op1) break;
              pIVar34 = (J->cur).ir + (pIVar34->field_0).op1;
              (pIVar34->field_1).t.irt = (pIVar34->field_1).t.irt & 0xdf;
            } while ((pIVar34->field_1).o == 'd');
          }
        }
        uVar38 = uVar38 - 1;
      } while ((uint)uVar21 < (uint)uVar38);
    }
    uVar27 = (uint)(J->cur).nsnap;
    while (uVar27 = uVar27 - 1, uVar7 <= uVar27) {
      pSVar28 = (J->cur).snap;
      uVar38 = (ulong)pSVar28[uVar27].nent;
      if (uVar38 != 0) {
        uVar31 = pSVar28[uVar27].mapofs;
        pSVar11 = (J->cur).snapmap;
        uVar36 = 0;
        do {
          uVar19 = (ushort)pSVar11[uVar31 + uVar36];
          if (0x7fff < uVar19) {
            pbVar2 = (byte *)((long)(J->cur).ir + (ulong)uVar19 * 8 + 4);
            *pbVar2 = *pbVar2 & 0xdf;
          }
          uVar36 = uVar36 + 1;
        } while (uVar38 != uVar36);
      }
    }
  }
  uVar27 = J->maxslot + J->baseslot;
  if (1 < uVar27) {
    uVar38 = 1;
    do {
      uVar31 = (uint)(ushort)J->slot[uVar38];
      uVar36 = uVar41;
      do {
        uVar41 = uVar36;
        if ((uVar31 < 0x8000) ||
           (uVar18 = (ulong)uVar31, uVar31 == (ushort)puVar16[uVar18 - 0x8000])) break;
        pIVar34 = (J->cur).ir;
        bVar3 = *(byte *)((long)pIVar34 + uVar18 * 8 + 4);
        *(byte *)((long)pIVar34 + uVar18 * 8 + 4) = bVar3 & 0xdf;
        if ((bVar3 & 0x1f) < 3 || (char)((bVar3 & 0x40) >> 6) != '\0') {
          bVar13 = false;
        }
        else {
          *(byte *)((long)pIVar34 + uVar18 * 8 + 4) = bVar3 & 0xdf | 0x40;
          if (0x3f < (uint)uVar36) goto LAB_0014d2ee;
          uVar41 = (ulong)((uint)uVar36 + 1);
          aIStack_b8[uVar36] = (IRRef1)uVar31;
          uVar31 = (uint)(ushort)puVar16[uVar18 - 0x8000];
          bVar13 = (ushort)puVar16[uVar18 - 0x8000] <= uVar21;
        }
        uVar36 = uVar41;
      } while (bVar13);
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar27);
  }
  if (!bVar14) {
    if ((int)uVar41 == 0) {
      return (TValue *)0x0;
    }
    uVar38 = 0;
    bVar14 = false;
    do {
      do {
        bVar13 = bVar14;
        pIVar34 = (J->cur).ir;
        if ((*(byte *)((long)pIVar34 + (ulong)aIStack_b8[uVar38] * 8 + 4) & 0x20) == 0) {
          bVar3 = *(byte *)((long)pIVar34 +
                           (ulong)(ushort)puVar16[(ulong)aIStack_b8[uVar38] - 0x8000] * 8 + 4);
          if ((bVar3 & 0x20) != 0) {
            *(byte *)((long)pIVar34 +
                     (ulong)(ushort)puVar16[(ulong)aIStack_b8[uVar38] - 0x8000] * 8 + 4) =
                 bVar3 & 0xdf;
            bVar13 = true;
          }
        }
        uVar38 = uVar38 + 1;
        bVar14 = bVar13;
      } while (uVar38 != uVar41);
      uVar38 = 0;
      bVar14 = false;
    } while (bVar13);
  }
  if ((int)uVar41 != 0) {
    uVar38 = 0;
    do {
      uVar7 = aIStack_b8[uVar38];
      uVar36 = (ulong)uVar7;
      pIVar34 = (J->cur).ir;
      bVar3 = *(byte *)((long)pIVar34 + uVar36 * 8 + 4);
      if ((bVar3 & 0x20) == 0) {
        uVar19 = puVar16[uVar36 - 0x8000];
        if (uVar21 < uVar19) {
          pbVar2 = (byte *)((long)pIVar34 + (ulong)uVar19 * 8 + 4);
          *pbVar2 = *pbVar2 | 0x40;
        }
        (J->fold).ins.field_0.ot = *(byte *)((long)pIVar34 + uVar36 * 8 + 4) & 0x1f | 0x1300;
        (J->fold).ins.field_0.op1 = uVar7;
        (J->fold).ins.field_0.op2 = uVar19;
        lj_ir_emit(J);
      }
      else {
        *(byte *)((long)pIVar34 + uVar36 * 8 + 4) = bVar3 & 0x9f;
      }
      uVar38 = uVar38 + 1;
    } while (uVar41 != uVar38);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((LoopState *)ud);
  return NULL;
}